

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::~FederateState(FederateState *this)

{
  InterfaceInfo *in_RDI;
  BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *unaff_retaddr;
  
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)unaff_retaddr);
  std::shared_ptr<helics::FederateOperator>::~shared_ptr
            ((shared_ptr<helics::FederateOperator> *)0x589920);
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
             *)unaff_retaddr);
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
            ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
             unaff_retaddr);
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::~vector
            ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)
             unaff_retaddr);
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::~vector
            ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)
             unaff_retaddr);
  std::
  map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  ::~map((map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
          *)0x589975);
  gmlc::containers::
  BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
  ::~BlockingQueue((BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
                    *)unaff_retaddr);
  gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  ~BlockingQueue(unaff_retaddr);
  std::shared_ptr<helics::MessageTimer>::~shared_ptr((shared_ptr<helics::MessageTimer> *)0x5899a8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::~unique_ptr
            ((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)in_RDI);
  InterfaceInfo::~InterfaceInfo(in_RDI);
  std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
  ~unique_ptr((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *)
              in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  return;
}

Assistant:

FederateState::~FederateState() = default;